

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int incomplete_type_p(c2m_ctx_t c2m_ctx,type *type)

{
  node_t_conflict pnVar1;
  node_t_conflict pnVar2;
  check_ctx *pcVar3;
  bool bVar4;
  
LAB_0014d9fe:
  bVar4 = false;
  switch(type->mode) {
  case TM_BASIC:
    bVar4 = (type->u).basic_type == TP_VOID;
    goto switchD_0014da15_caseD_3;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    pnVar1 = (type->u).tag_type;
    pnVar2 = DLIST_node_t_el(&(pnVar1->u).ops,1);
    if (pnVar2->code != N_IGNORE) {
      pcVar3 = c2m_ctx->check_ctx;
      while (((pnVar2 = pcVar3->curr_scope, pnVar2 != (node_t_conflict)0x0 && (pnVar2 != pnVar1)) &&
             (pnVar2 != c2m_ctx->top_scope))) {
        pcVar3 = (check_ctx *)((long)pnVar2->attr + 0x20);
      }
      bVar4 = pnVar2 == pnVar1;
      goto switchD_0014da15_caseD_3;
    }
    break;
  default:
    goto switchD_0014da15_caseD_3;
  case TM_ARR:
    if (((type->u).arr_type)->size->code != N_IGNORE) {
      type = ((type->u).arr_type)->el_type;
      goto LAB_0014d9fe;
    }
    break;
  case TM_FUNC:
    type = ((type->u).ptr_type)->arr_type;
    if (type == (type *)0x0) break;
    if ((type->mode == TM_BASIC) && ((type->u).basic_type == TP_VOID)) {
      bVar4 = false;
switchD_0014da15_caseD_3:
      return (int)bVar4;
    }
    goto LAB_0014d9fe;
  }
  bVar4 = true;
  goto switchD_0014da15_caseD_3;
}

Assistant:

static int incomplete_type_p (c2m_ctx_t c2m_ctx, struct type *type) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  switch (type->mode) {
  case TM_BASIC: return type->u.basic_type == TP_VOID;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: {
    node_t scope, n = type->u.tag_type;

    if (NL_EL (n->u.ops, 1)->code == N_IGNORE) return TRUE;
    for (scope = curr_scope; scope != NULL && scope != top_scope && scope != n;
         scope = ((struct node_scope *) scope->attr)->scope)
      ;
    return scope == n;
  }
  case TM_PTR: return FALSE;
  case TM_ARR: {
    struct arr_type *arr_type = type->u.arr_type;

    return (arr_type->size->code == N_IGNORE || incomplete_type_p (c2m_ctx, arr_type->el_type));
  }
  case TM_FUNC:
    return ((type = type->u.func_type->ret_type) == NULL
            || (!void_type_p (type) && incomplete_type_p (c2m_ctx, type)));
  default: return FALSE;
  }
}